

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

void __thiscall
QAbstractFileEngineIterator::~QAbstractFileEngineIterator(QAbstractFileEngineIterator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

QAbstractFileEngineIterator::~QAbstractFileEngineIterator()
{
}